

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O3

int handle_erratum_skd022(pt_insn_decoder *decoder)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  pt_insn_ext iext;
  pt_insn insn;
  pt_insn_ext local_3c;
  pt_insn local_30;
  
  local_30.mode = decoder->mode;
  local_30.ip = decoder->ip;
  iVar2 = pt_insn_decode(&local_30,&local_3c,decoder->image,&decoder->asid);
  iVar3 = 0;
  if ((-1 < iVar2) && (0xfffffffd < local_3c.iclass - PTI_INST_VMCALL)) {
    uVar1 = (decoder->event).variant.async_disabled.ip;
    (decoder->event).type = ptev_disabled;
    (decoder->event).variant.enabled.ip = uVar1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static inline int handle_erratum_skd022(struct pt_insn_decoder *decoder)
{
	struct pt_event *ev;
	uint64_t ip;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = check_erratum_skd022(decoder);
	if (errcode <= 0)
		return errcode;

	/* We turn the async disable into a sync disable.  It will be processed
	 * after decoding the instruction.
	 */
	ev = &decoder->event;

	ip = ev->variant.async_disabled.ip;

	ev->type = ptev_disabled;
	ev->variant.disabled.ip = ip;

	return 1;
}